

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.cpp
# Opt level: O0

void __thiscall vera::PingPong::clear(PingPong *this,float _alpha)

{
  int local_18;
  int i;
  float _alpha_local;
  PingPong *this_local;
  
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    (**(code **)(*(long *)(&this->field_0x18 + (long)local_18 * 0x38) + 0x18))();
    glClearColor(0,0,0,_alpha);
    glClear(0x4100);
    (**(code **)(*(long *)(&this->field_0x18 + (long)local_18 * 0x38) + 0x20))();
  }
  return;
}

Assistant:

void PingPong::clear(float _alpha) {
    for(int i = 0; i < 2; i++){
        m_fbos[i].bind();
        glClearColor(0.0f, 0.0f, 0.0f, _alpha);
        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        m_fbos[i].unbind();
    }
}